

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

void settings::reset(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffea00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffea08;
  string *local_1450;
  string *local_1408;
  string *local_13d0;
  string *local_1398;
  string *local_12a0;
  string *local_11e8;
  string *local_1110;
  string *local_f88;
  string *local_f10;
  string *local_e48;
  string *local_e00;
  allocator local_d73;
  allocator local_d72;
  allocator local_d71;
  string *local_d70;
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string *local_d08;
  undefined8 local_d00;
  undefined1 local_cf3;
  allocator local_cf2;
  allocator local_cf1;
  string *local_cf0;
  string local_ce8 [32];
  string local_cc8 [32];
  string *local_ca8;
  undefined8 local_ca0;
  undefined1 local_c93;
  allocator local_c92;
  allocator local_c91;
  string *local_c90;
  string local_c88 [32];
  string local_c68 [32];
  string *local_c48;
  undefined8 local_c40;
  undefined1 local_c37;
  allocator local_c36;
  allocator local_c35;
  allocator local_c34;
  allocator local_c33;
  allocator local_c32;
  allocator local_c31;
  allocator local_c30;
  allocator local_c2f;
  allocator local_c2e;
  allocator local_c2d;
  allocator local_c2c;
  allocator local_c2b;
  allocator local_c2a;
  allocator local_c29;
  string *local_c28;
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string *local_a60;
  undefined8 local_a58;
  undefined1 local_a4b;
  allocator local_a4a;
  allocator local_a49;
  allocator local_a48;
  allocator local_a47;
  allocator local_a46;
  allocator local_a45;
  allocator local_a44;
  allocator local_a43;
  allocator local_a42;
  allocator local_a41;
  string *local_a40;
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string *local_8f8;
  undefined8 local_8f0;
  undefined1 local_8e5;
  allocator local_8e4;
  allocator local_8e3;
  allocator local_8e2;
  allocator local_8e1;
  allocator local_8e0;
  allocator local_8df;
  allocator local_8de;
  allocator local_8dd;
  allocator local_8dc;
  allocator local_8db;
  allocator local_8da;
  allocator local_8d9;
  string *local_8d8;
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string *local_750;
  undefined8 local_748;
  undefined1 local_740;
  allocator local_73f;
  allocator local_73e;
  allocator local_73d;
  allocator local_73c;
  allocator local_73b;
  allocator local_73a;
  allocator local_739;
  allocator local_738;
  allocator local_737;
  allocator local_736;
  allocator local_735;
  allocator local_734;
  allocator local_733;
  allocator local_732;
  allocator local_731;
  allocator local_730;
  allocator local_72f;
  allocator local_72e;
  allocator local_72d;
  allocator local_72c;
  allocator local_72b;
  allocator local_72a;
  allocator local_729;
  string *local_728;
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string *local_440;
  undefined8 local_438;
  undefined1 local_42f;
  allocator local_42e;
  allocator local_42d;
  allocator local_42c;
  allocator local_42b;
  allocator local_42a;
  allocator local_429;
  string *local_428;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string *local_360;
  undefined8 local_358;
  undefined1 local_34c;
  allocator local_34b;
  allocator local_34a;
  allocator local_349;
  allocator local_348;
  allocator local_347;
  allocator local_346;
  allocator local_345;
  allocator local_344;
  allocator local_343;
  allocator local_342;
  allocator local_341;
  string *local_340;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  string *local_1c0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string *local_158;
  undefined8 local_150;
  undefined1 local_144;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  allocator local_140;
  allocator local_13f;
  allocator local_13e;
  allocator local_13d [20];
  allocator local_129;
  string *local_128;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  undefined8 local_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_144 = 1;
  local_128 = local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"prn",&local_129);
  local_128 = local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"print",local_13d);
  local_128 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"form",&local_13e);
  local_128 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"fmt",&local_13f);
  local_128 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"log",&local_140);
  local_128 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"debug",&local_141);
  local_128 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"dbg",&local_142);
  local_128 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"assert",&local_143);
  local_144 = 0;
  local_20 = local_120;
  local_18 = 8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_e00 = (string *)&local_20;
  do {
    local_e00 = local_e00 + -0x20;
    std::__cxx11::string::~string(local_e00);
  } while (local_e00 != local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_143);
  std::allocator<char>::~allocator((allocator<char> *)&local_142);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e);
  std::allocator<char>::~allocator((allocator<char> *)local_13d);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_1c4 = 1;
  local_1c0 = local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"indexof",&local_1c1);
  local_1c0 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"findindex",&local_1c2);
  local_1c0 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"findvalue",&local_1c3);
  local_1c4 = 0;
  local_158 = local_1b8;
  local_150 = 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_e48 = (string *)&local_158;
  do {
    local_e48 = local_e48 + -0x20;
    std::__cxx11::string::~string(local_e48);
  } while (local_e48 != local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c3);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  local_34c = 1;
  local_340 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"findvalue",&local_341);
  local_340 = local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"findindex",&local_342);
  local_340 = local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"__update",&local_343);
  local_340 = local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"filter",&local_344);
  local_340 = local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"map",&local_345);
  local_340 = local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"reduce",&local_346);
  local_340 = local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"each",&local_347);
  local_340 = local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"sort",&local_348);
  local_340 = local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"assert",&local_349);
  local_340 = local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"persist",&local_34a);
  local_340 = local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"join",&local_34b);
  local_34c = 0;
  local_1d8 = local_338;
  local_1d0 = 0xb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_f10 = (string *)&local_1d8;
  do {
    local_f10 = local_f10 + -0x20;
    std::__cxx11::string::~string(local_f10);
  } while (local_f10 != local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_34b);
  std::allocator<char>::~allocator((allocator<char> *)&local_34a);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::~allocator((allocator<char> *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_347);
  std::allocator<char>::~allocator((allocator<char> *)&local_346);
  std::allocator<char>::~allocator((allocator<char> *)&local_345);
  std::allocator<char>::~allocator((allocator<char> *)&local_344);
  std::allocator<char>::~allocator((allocator<char> *)&local_343);
  std::allocator<char>::~allocator((allocator<char> *)&local_342);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  local_42f = 1;
  local_428 = local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"require",&local_429);
  local_428 = local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"require_optional",&local_42a);
  local_428 = local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"vargv",&local_42b);
  local_428 = local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"persist",&local_42c);
  local_428 = local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"getclass",&local_42d);
  local_428 = local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"keepref",&local_42e);
  local_42f = 0;
  local_360 = local_420;
  local_358 = 6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_f88 = (string *)&local_360;
  do {
    local_f88 = local_f88 + -0x20;
    std::__cxx11::string::~string(local_f88);
  } while (local_f88 != local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_42e);
  std::allocator<char>::~allocator((allocator<char> *)&local_42d);
  std::allocator<char>::~allocator((allocator<char> *)&local_42c);
  std::allocator<char>::~allocator((allocator<char> *)&local_42b);
  std::allocator<char>::~allocator((allocator<char> *)&local_42a);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  local_740 = 1;
  local_728 = local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"seterrorhandler",&local_729);
  local_728 = local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"setdebughook",&local_72a);
  local_728 = local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"enabledebuginfo",&local_72b);
  local_728 = local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"getstackinfos",&local_72c);
  local_728 = local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"getroottable",&local_72d);
  local_728 = local_680;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"setroottable",&local_72e);
  local_728 = local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"getconsttable",&local_72f);
  local_728 = local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"setconsttable",&local_730);
  local_728 = local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"getclass",&local_731);
  local_728 = local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"assert",&local_732);
  local_728 = local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"print",&local_733);
  local_728 = local_5c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"error",&local_734);
  local_728 = local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"compilestring",&local_735);
  local_728 = local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"newthread",&local_736);
  local_728 = local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"suspend",&local_737);
  local_728 = local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"array",&local_738);
  local_728 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"type",&local_739);
  local_728 = local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"callee",&local_73a);
  local_728 = local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"collectgarbage",&local_73b);
  local_728 = local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"resurrectunreachable",&local_73c);
  local_728 = local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"min",&local_73d);
  local_728 = local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"max",&local_73e);
  local_728 = local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"clamp",&local_73f);
  local_740 = 0;
  local_440 = local_720;
  local_438 = 0x17;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_1110 = (string *)&local_440;
  do {
    local_1110 = local_1110 + -0x20;
    std::__cxx11::string::~string(local_1110);
  } while (local_1110 != local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_73f);
  std::allocator<char>::~allocator((allocator<char> *)&local_73e);
  std::allocator<char>::~allocator((allocator<char> *)&local_73d);
  std::allocator<char>::~allocator((allocator<char> *)&local_73c);
  std::allocator<char>::~allocator((allocator<char> *)&local_73b);
  std::allocator<char>::~allocator((allocator<char> *)&local_73a);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::allocator<char>::~allocator((allocator<char> *)&local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_737);
  std::allocator<char>::~allocator((allocator<char> *)&local_736);
  std::allocator<char>::~allocator((allocator<char> *)&local_735);
  std::allocator<char>::~allocator((allocator<char> *)&local_734);
  std::allocator<char>::~allocator((allocator<char> *)&local_733);
  std::allocator<char>::~allocator((allocator<char> *)&local_732);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::allocator<char>::~allocator((allocator<char> *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_72f);
  std::allocator<char>::~allocator((allocator<char> *)&local_72e);
  std::allocator<char>::~allocator((allocator<char> *)&local_72d);
  std::allocator<char>::~allocator((allocator<char> *)&local_72c);
  std::allocator<char>::~allocator((allocator<char> *)&local_72b);
  std::allocator<char>::~allocator((allocator<char> *)&local_72a);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  local_8e5 = 1;
  local_8d8 = local_8d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"__merge",&local_8d9);
  local_8d8 = local_8b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"indexof",&local_8da);
  local_8d8 = local_890;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"findindex",&local_8db);
  local_8d8 = local_870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"findvalue",&local_8dc);
  local_8d8 = local_850;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"len",&local_8dd);
  local_8d8 = local_830;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"reduce",&local_8de);
  local_8d8 = local_810;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"tostring",&local_8df);
  local_8d8 = local_7f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"tointeger",&local_8e0);
  local_8d8 = local_7d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d0,"tofloat",&local_8e1);
  local_8d8 = local_7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"slice",&local_8e2);
  local_8d8 = local_790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"tolower",&local_8e3);
  local_8d8 = local_770;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"toupper",&local_8e4);
  local_8e5 = 0;
  local_750 = local_8d0;
  local_748 = 0xc;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_11e8 = (string *)&local_750;
  do {
    local_11e8 = local_11e8 + -0x20;
    std::__cxx11::string::~string(local_11e8);
  } while (local_11e8 != local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e4);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e3);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8df);
  std::allocator<char>::~allocator((allocator<char> *)&local_8de);
  std::allocator<char>::~allocator((allocator<char> *)&local_8dd);
  std::allocator<char>::~allocator((allocator<char> *)&local_8dc);
  std::allocator<char>::~allocator((allocator<char> *)&local_8db);
  std::allocator<char>::~allocator((allocator<char> *)&local_8da);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  local_a4b = 1;
  local_a40 = local_a38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"subst",&local_a41);
  local_a40 = local_a18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"concat",&local_a42);
  local_a40 = local_9f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"tostring",&local_a43);
  local_a40 = local_9d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"toupper",&local_a44);
  local_a40 = local_9b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"tolower",&local_a45);
  local_a40 = local_998;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"slice",&local_a46);
  local_a40 = local_978;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"trim",&local_a47);
  local_a40 = local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"join",&local_a48);
  local_a40 = local_938;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"format",&local_a49);
  local_a40 = local_918;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_918,"replace",&local_a4a);
  local_a4b = 0;
  local_8f8 = local_a38;
  local_8f0 = 10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_12a0 = (string *)&local_8f8;
  do {
    local_12a0 = local_12a0 + -0x20;
    std::__cxx11::string::~string(local_12a0);
  } while (local_12a0 != local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  std::allocator<char>::~allocator((allocator<char> *)&local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a47);
  std::allocator<char>::~allocator((allocator<char> *)&local_a46);
  std::allocator<char>::~allocator((allocator<char> *)&local_a45);
  std::allocator<char>::~allocator((allocator<char> *)&local_a44);
  std::allocator<char>::~allocator((allocator<char> *)&local_a43);
  std::allocator<char>::~allocator((allocator<char> *)&local_a42);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  local_c37 = 1;
  local_c28 = local_c20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c20,"has",&local_c29);
  local_c28 = local_c00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c00,"Has",&local_c2a);
  local_c28 = local_be0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be0,"have",&local_c2b);
  local_c28 = local_bc0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"Have",&local_c2c);
  local_c28 = local_ba0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"should",&local_c2d);
  local_c28 = local_b80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b80,"Should",&local_c2e);
  local_c28 = local_b60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"need",&local_c2f);
  local_c28 = local_b40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"Need",&local_c30);
  local_c28 = local_b20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b20,"is",&local_c31);
  local_c28 = local_b00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"Is",&local_c32);
  local_c28 = local_ae0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"was",&local_c33);
  local_c28 = local_ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"Was",&local_c34);
  local_c28 = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"will",&local_c35);
  local_c28 = local_a80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a80,"Will",&local_c36);
  local_c37 = 0;
  local_a60 = local_c20;
  local_a58 = 0xe;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_1398 = (string *)&local_a60;
  do {
    local_1398 = local_1398 + -0x20;
    std::__cxx11::string::~string(local_1398);
  } while (local_1398 != local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c36);
  std::allocator<char>::~allocator((allocator<char> *)&local_c35);
  std::allocator<char>::~allocator((allocator<char> *)&local_c34);
  std::allocator<char>::~allocator((allocator<char> *)&local_c33);
  std::allocator<char>::~allocator((allocator<char> *)&local_c32);
  std::allocator<char>::~allocator((allocator<char> *)&local_c31);
  std::allocator<char>::~allocator((allocator<char> *)&local_c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2c);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2b);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_c29);
  local_c93 = 1;
  local_c90 = local_c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c88,"get",&local_c91);
  local_c90 = local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"Get",&local_c92);
  local_c93 = 0;
  local_c48 = local_c88;
  local_c40 = 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_13d0 = (string *)&local_c48;
  do {
    local_13d0 = local_13d0 + -0x20;
    std::__cxx11::string::~string(local_13d0);
  } while (local_13d0 != local_c88);
  std::allocator<char>::~allocator((allocator<char> *)&local_c92);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  local_cf3 = 1;
  local_cf0 = local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"require",&local_cf1);
  local_cf0 = local_cc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc8,"require_optional",&local_cf2);
  local_cf3 = 0;
  local_ca8 = local_ce8;
  local_ca0 = 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_1408 = (string *)&local_ca8;
  do {
    local_1408 = local_1408 + -0x20;
    std::__cxx11::string::~string(local_1408);
  } while (local_1408 != local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf2);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  local_d70 = local_d68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"extend",&local_d71);
  local_d70 = local_d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"append",&local_d72);
  local_d70 = local_d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d28,"__update",&local_d73);
  local_d08 = local_d68;
  local_d00 = 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffea00,in_stack_ffffffffffffea08);
  local_1450 = (string *)&local_d08;
  do {
    local_1450 = local_1450 + -0x20;
    std::__cxx11::string::~string(local_1450);
  } while (local_1450 != local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d73);
  std::allocator<char>::~allocator((allocator<char> *)&local_d72);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  return;
}

Assistant:

void reset()
  {
    forbidden_function = { };

    format_function_name =
    {
      "prn",
      "print",
      "form",
      "fmt",
      "log",
      "debug",
      "dbg",
      "assert",
    };

    function_can_return_null =
    {
      "indexof",
      "findindex",
      "findvalue",
    };

    function_calls_lambda_inplace =
    {
      "findvalue",
      "findindex",
      "__update",
      "filter",
      "map",
      "reduce",
      "each",
      "sort",
      "assert",
      "persist",
      "join",
    };

    std_identifier =
    {
      "require",
      "require_optional",
      "vargv",
      "persist",
      "getclass",
      "keepref",
    };

    std_function =
    {
      "seterrorhandler",
      "setdebughook",
      "enabledebuginfo",
      "getstackinfos",
      "getroottable",
      "setroottable",
      "getconsttable",
      "setconsttable",
      "getclass",
      "assert",
      "print",
      "error",
      "compilestring",
      "newthread",
      "suspend",
      "array",
      "type",
      "callee",
      "collectgarbage",
      "resurrectunreachable",
      "min",
      "max",
      "clamp",
    };

    function_result_must_be_utilized =
    {
      "__merge",
      "indexof",
      "findindex",
      "findvalue",
      "len",
      "reduce",
      "tostring",
      "tointeger",
      "tofloat",
      "slice",
      "tolower",
      "toupper",
    };

    function_can_return_string =
    {
      "subst",
      "concat",
      "tostring",
      "toupper",
      "tolower",
      "slice",
      "trim",
      "join",
      "format",
      "replace",
    };

    function_should_return_bool_prefix =
    {
      "has",
      "Has",
      "have",
      "Have",
      "should",
      "Should",
      "need",
      "Need",
      "is",
      "Is",
      "was",
      "Was",
      "will",
      "Will",
    };

    function_should_return_something_prefix =
    {
      "get",
      "Get",
    };

    function_forbidden_parent_dir =
    {
      "require",
      "require_optional",
    };

    function_modifies_object =
    {
      "extend",
      "append",
      "__update",
    };
  }